

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O3

bool __thiscall SQArray::Remove(SQArray *this,SQInteger idx)

{
  bool bVar1;
  
  if ((idx < 0) || ((long)(this->_values)._size <= idx)) {
    bVar1 = false;
  }
  else {
    sqvector<SQObjectPtr>::remove(&this->_values,(char *)idx);
    bVar1 = true;
    if ((this->_values)._size <= (this->_values)._allocated >> 2) {
      sqvector<SQObjectPtr>::shrinktofit(&this->_values);
    }
  }
  return bVar1;
}

Assistant:

bool Remove(SQInteger idx){
        if(idx < 0 || idx >= (SQInteger)_values.size())
            return false;
        _values.remove(idx);
        ShrinkIfNeeded();
        return true;
    }